

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  int iVar1;
  bool bVar2;
  reference this_00;
  const_reference pvVar3;
  pointer this_01;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *pvVar4;
  reference pvVar5;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  cmGraphEdge local_a4;
  cmGraphEdge local_9c;
  int local_94;
  const_iterator cStack_90;
  int j;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_88;
  const_iterator ei;
  EdgeList *el;
  set<int,_std::less<int>,_std::allocator<int>_> *emitted_local;
  int *head_local;
  int i_local;
  int c_local;
  vector<int,_std::allocator<int>_> *cmap_local;
  cmComputeTargetDepends *this_local;
  
  head_local._0_4_ = i;
  head_local._4_4_ = c;
  _i_local = cmap;
  cmap_local = (vector<int,_std::allocator<int>_> *)this;
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (visited,(value_type_conflict2 *)&head_local);
  if (((pVar6.second ^ 0xffU) & 1) == 0) {
    pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (emitted,(value_type_conflict2 *)&head_local);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ei._M_current =
           (cmGraphEdge *)
           std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                     (&(this->InitialGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                      (long)(int)head_local);
      local_88._M_current =
           (cmGraphEdge *)
           std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                     ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ei._M_current);
      while( true ) {
        cStack_90 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(ei._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_88,&stack0xffffffffffffff70);
        iVar1 = (int)head_local;
        if (!bVar2) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                  ::operator*(&local_88);
        local_94 = cmGraphEdge::operator_cast_to_int(this_00);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_i_local,(long)local_94);
        if (*pvVar3 == head_local._4_4_) {
          this_01 = __gnu_cxx::
                    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                    ::operator->(&local_88);
          bVar2 = cmGraphEdge::IsStrong(this_01);
          if (bVar2) {
            pvVar4 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                                (&(this->FinalGraph).
                                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                                 (long)(int)head_local)->
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
            cmGraphEdge::cmGraphEdge(&local_9c,local_94,true);
            std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(pvVar4,&local_9c);
            bVar2 = IntraComponent(this,_i_local,head_local._4_4_,local_94,head,emitted,visited);
            if (!bVar2) {
              return false;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
        ::operator++(&local_88);
      }
      if (*head < 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->ComponentTail,(long)head_local._4_4_);
        *pvVar5 = iVar1;
      }
      else {
        pvVar4 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->FinalGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (long)(int)head_local)->
                  super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        cmGraphEdge::cmGraphEdge(&local_a4,*head,false);
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(pvVar4,&local_a4);
      }
      *head = (int)head_local;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (EdgeList::const_iterator ei = el.begin(); ei != el.end(); ++ei) {
      int j = *ei;
      if (cmap[j] == c && ei->IsStrong()) {
        this->FinalGraph[i].push_back(cmGraphEdge(j, true));
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].push_back(cmGraphEdge(*head, false));
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}